

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_dump.hpp
# Opt level: O2

void ELFIO::dump::symbol_table
               (ostream *out,Elf_Xword no,string *name,Elf64_Addr value,Elf_Xword size,uchar bind,
               uchar type,Elf_Half section,uint elf_class)

{
  undefined4 uVar1;
  long lVar2;
  long lVar3;
  ostream *poVar4;
  uchar key;
  string local_70 [32];
  string local_50 [32];
  
  uVar1 = *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18);
  poVar4 = std::operator<<(out,"[");
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 5;
  poVar4 = std::operator<<(poVar4,0x20);
  lVar2 = *(long *)poVar4;
  lVar3 = *(long *)(lVar2 + -0x18);
  *(uint *)(poVar4 + lVar3 + 0x18) = *(uint *)(poVar4 + lVar3 + 0x18) & 0xffffffb5 | 2;
  lVar2 = *(long *)(lVar2 + -0x18);
  *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffff4f | 0x80;
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4,"] ");
  poVar4 = std::operator<<(poVar4,"0x");
  key = (uchar)((uint)uVar1 >> 0x18);
  if (elf_class == 1) {
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 8;
    poVar4 = std::operator<<(poVar4,0x30);
    lVar2 = *(long *)poVar4;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar4 + lVar3 + 0x18) = *(uint *)(poVar4 + lVar3 + 0x18) & 0xffffffb5 | 8;
    lVar2 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffff4f | 0x80;
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::operator<<(poVar4,"0x");
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 8;
    poVar4 = std::operator<<(poVar4,0x30);
    lVar2 = *(long *)poVar4;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar4 + lVar3 + 0x18) = *(uint *)(poVar4 + lVar3 + 0x18) & 0xffffffb5 | 8;
    lVar2 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffff4f | 0x80;
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," ");
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 7;
    poVar4 = std::operator<<(poVar4,0x20);
    lVar2 = *(long *)poVar4;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar4 + lVar3 + 0x18) = *(uint *)(poVar4 + lVar3 + 0x18) & 0xffffffb5 | 8;
    lVar2 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffff4f | 0x20;
    str_symbol_type<unsigned_char>(key);
    poVar4 = std::operator<<(poVar4,local_50);
    poVar4 = std::operator<<(poVar4," ");
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 8;
    poVar4 = std::operator<<(poVar4,0x20);
    lVar2 = *(long *)poVar4;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar4 + lVar3 + 0x18) = *(uint *)(poVar4 + lVar3 + 0x18) & 0xffffffb5 | 8;
    lVar2 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffff4f | 0x20;
    str_symbol_bind<unsigned_char>(key);
    poVar4 = std::operator<<(poVar4,local_70);
    poVar4 = std::operator<<(poVar4," ");
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 5;
    poVar4 = std::operator<<(poVar4,0x20);
    lVar2 = *(long *)poVar4;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar4 + lVar3 + 0x18) = *(uint *)(poVar4 + lVar3 + 0x18) & 0xffffffb5 | 2;
    lVar2 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffff4f | 0x80;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,section);
    poVar4 = std::operator<<(poVar4," ");
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 1;
    poVar4 = std::operator<<(poVar4,0x20);
    lVar2 = *(long *)poVar4;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar4 + lVar3 + 0x18) = *(uint *)(poVar4 + lVar3 + 0x18) & 0xffffffb5 | 8;
    lVar2 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffff4f | 0x20;
    poVar4 = std::operator<<(poVar4,(string *)name);
    poVar4 = std::operator<<(poVar4," ");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  else {
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0x10;
    poVar4 = std::operator<<(poVar4,0x30);
    lVar2 = *(long *)poVar4;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar4 + lVar3 + 0x18) = *(uint *)(poVar4 + lVar3 + 0x18) & 0xffffffb5 | 8;
    lVar2 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffff4f | 0x80;
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::operator<<(poVar4,"0x");
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0x10;
    poVar4 = std::operator<<(poVar4,0x30);
    lVar2 = *(long *)poVar4;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar4 + lVar3 + 0x18) = *(uint *)(poVar4 + lVar3 + 0x18) & 0xffffffb5 | 8;
    lVar2 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffff4f | 0x80;
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," ");
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 7;
    poVar4 = std::operator<<(poVar4,0x20);
    lVar2 = *(long *)poVar4;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar4 + lVar3 + 0x18) = *(uint *)(poVar4 + lVar3 + 0x18) & 0xffffffb5 | 8;
    lVar2 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffff4f | 0x20;
    str_symbol_type<unsigned_char>(key);
    poVar4 = std::operator<<(poVar4,local_50);
    poVar4 = std::operator<<(poVar4," ");
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 8;
    poVar4 = std::operator<<(poVar4,0x20);
    lVar2 = *(long *)poVar4;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar4 + lVar3 + 0x18) = *(uint *)(poVar4 + lVar3 + 0x18) & 0xffffffb5 | 8;
    lVar2 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffff4f | 0x20;
    str_symbol_bind<unsigned_char>(key);
    poVar4 = std::operator<<(poVar4,local_70);
    poVar4 = std::operator<<(poVar4," ");
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 5;
    poVar4 = std::operator<<(poVar4,0x20);
    lVar2 = *(long *)poVar4;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar4 + lVar3 + 0x18) = *(uint *)(poVar4 + lVar3 + 0x18) & 0xffffffb5 | 2;
    lVar2 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffff4f | 0x80;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,section);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<(poVar4,"        ");
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 1;
    poVar4 = std::operator<<(poVar4,0x20);
    lVar2 = *(long *)poVar4;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar4 + lVar3 + 0x18) = *(uint *)(poVar4 + lVar3 + 0x18) & 0xffffffb5 | 8;
    lVar2 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffff4f | 0x20;
    poVar4 = std::operator<<(poVar4,(string *)name);
    poVar4 = std::operator<<(poVar4," ");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = uVar1;
  return;
}

Assistant:

static void symbol_table( std::ostream&      out,
                              Elf_Xword          no,
                              const std::string& name,
                              Elf64_Addr         value,
                              Elf_Xword          size,
                              unsigned char      bind,
                              unsigned char      type,
                              Elf_Half           section,
                              unsigned int       elf_class )
    {
        std::ios_base::fmtflags original_flags = out.flags();

        if ( elf_class == ELFCLASS32 ) { // Output for 32-bit
            out << "[" << DUMP_DEC_FORMAT( 5 ) << no << "] "
                << DUMP_HEX0x_FORMAT( 8 ) << value << " "
                << DUMP_HEX0x_FORMAT( 8 ) << size << " " << DUMP_STR_FORMAT( 7 )
                << str_symbol_type( type ) << " " << DUMP_STR_FORMAT( 8 )
                << str_symbol_bind( bind ) << " " << DUMP_DEC_FORMAT( 5 )
                << section << " " << DUMP_STR_FORMAT( 1 ) << name << " "
                << std::endl;
        }
        else { // Output for 64-bit
            out << "[" << DUMP_DEC_FORMAT( 5 ) << no << "] "
                << DUMP_HEX0x_FORMAT( 16 ) << value << " "
                << DUMP_HEX0x_FORMAT( 16 ) << size << " "
                << DUMP_STR_FORMAT( 7 ) << str_symbol_type( type ) << " "
                << DUMP_STR_FORMAT( 8 ) << str_symbol_bind( bind ) << " "
                << DUMP_DEC_FORMAT( 5 ) << section << " " << std::endl
                << "        " << DUMP_STR_FORMAT( 1 ) << name << " "
                << std::endl;
        }

        out.flags( original_flags );
    }